

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::reset_srv_to_leave(raft_server *this)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  element_type *peVar3;
  int __how;
  int in_ESI;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  string local_28 [40];
  
  this_00 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a646f);
  peer::shutdown(this_00,in_ESI,__how);
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::reset(in_RDI);
  in_RDI[0x3c]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[0x31]._M_refcount);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a64be);
    iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
    if (3 < iVar2) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a64e1);
      msg_if_given_abi_cxx11_((char *)local_28,"clearing srv_to_leave_");
      (**(code **)(*(long *)peVar3 + 0x40))
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"reset_srv_to_leave",0x263,local_28);
      std::__cxx11::string::~string(local_28);
    }
  }
  return;
}

Assistant:

void raft_server::reset_srv_to_leave() {
    srv_to_leave_->shutdown();
    srv_to_leave_.reset();
    srv_to_leave_target_idx_ = 0;
    p_in("clearing srv_to_leave_");
}